

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Item * __thiscall
Map<unsigned_int,_Error::Private::Str>::rebal
          (Map<unsigned_int,_Error::Private::Str> *this,Item *item)

{
  long lVar1;
  Item *pIVar2;
  ulong uVar3;
  code *pcVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  Item **cell;
  
  lVar1 = item->slope;
  if (lVar1 < 2) {
    if (-2 < lVar1) {
      return item;
    }
    if ((lVar1 != -2) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1e5,"item->slope == -2"), iVar5 != 0)) goto LAB_00103e55;
    pIVar2 = item->parent;
    if (pIVar2 == (Item *)0x0) {
      cell = &this->root;
    }
    else {
      cell = &pIVar2->right;
      if (pIVar2->left == item) {
        cell = &pIVar2->left;
      }
    }
    if ((*cell != item) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1e8,"cell == item"), iVar5 != 0)) goto LAB_00103e55;
    shiftl(cell);
    uVar3 = (*cell)->slope;
    uVar6 = -uVar3;
    if (0 < (long)uVar3) {
      uVar6 = uVar3;
    }
    if (uVar6 < 2) {
      return *cell;
    }
    uVar7 = 0x1ea;
  }
  else {
    if ((lVar1 != 2) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1db,"item->slope == 2"), iVar5 != 0)) goto LAB_00103e55;
    pIVar2 = item->parent;
    if (pIVar2 == (Item *)0x0) {
      cell = &this->root;
    }
    else {
      cell = &pIVar2->right;
      if (pIVar2->left == item) {
        cell = &pIVar2->left;
      }
    }
    if ((*cell != item) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1de,"cell == item"), iVar5 != 0)) goto LAB_00103e55;
    shiftr(cell);
    uVar3 = (*cell)->slope;
    uVar6 = -uVar3;
    if (0 < (long)uVar3) {
      uVar6 = uVar3;
    }
    if (uVar6 < 2) {
      return *cell;
    }
    uVar7 = 0x1e0;
  }
  iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                        ,uVar7,"(cell->slope < 0 ? -cell->slope : cell->slope) <= 1");
  if (iVar5 == 0) {
    return *cell;
  }
LAB_00103e55:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

Item* rebal(Item* item)
  {
    if(item->slope > 1)
    {
      ASSERT(item->slope == 2);
      Item* parent = item->parent;
      Item*& cell = parent ? (parent->left == item ? parent->left : parent->right) : root;
      ASSERT(cell == item);
      shiftr(cell);
      ASSERT((cell->slope < 0 ? -cell->slope : cell->slope) <= 1);
      return cell;
    }
    else if(item->slope < -1)
    {
      ASSERT(item->slope == -2);
      Item* parent = item->parent;
      Item*& cell = parent ? (parent->left == item ? parent->left : parent->right) : root;
      ASSERT(cell == item);
      shiftl(cell);
      ASSERT((cell->slope < 0 ? -cell->slope : cell->slope) <= 1);
      return cell;
    }
    return item;
  }